

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRBlock * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::allocate<spirv_cross::SPIRBlock&>
          (ObjectPool<spirv_cross::SPIRBlock> *this,SPIRBlock *p)

{
  size_t sVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Hints HVar4;
  BlockID BVar5;
  BlockID BVar6;
  BlockID BVar7;
  ID IVar8;
  ID IVar9;
  BlockID BVar10;
  BlockID BVar11;
  BlockID BVar12;
  ID IVar13;
  bool bVar14;
  bool bVar15;
  undefined1 uVar16;
  _Tuple_impl<0UL,_spirv_cross::SPIRBlock_*,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
  _Var17;
  ulong uVar18;
  uint uVar19;
  _Head_base<0UL,_spirv_cross::SPIRBlock_*,_false> _Var20;
  SPIRBlock *pSVar21;
  
  if ((this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size == 0) {
    uVar19 = this->start_object_count <<
             ((byte)(this->memory).
                    super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
                    .buffer_size & 0x1f);
    uVar18 = (ulong)uVar19;
    _Var17.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>)malloc(uVar18 * 0x3d0);
    if (_Var17.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl !=
        (SPIRBlock *)0x0) {
      _Var20._M_head_impl =
           (SPIRBlock *)_Var17.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl;
      if (uVar19 != 0) {
        do {
          SmallVector<spirv_cross::SPIRBlock_*,_0UL>::reserve
                    (&this->vacants,
                     (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size + 1);
          sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size;
          (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.ptr[sVar1] =
               _Var20._M_head_impl;
          (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size = sVar1 + 1;
          uVar18 = uVar18 - 1;
          _Var20._M_head_impl = _Var20._M_head_impl + 1;
        } while (uVar18 != 0);
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRBlock_*,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false> =
           _Var17.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var17.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl !=
          (SPIRBlock *)0x0) goto LAB_0034c0b0;
    }
    pSVar21 = (SPIRBlock *)0x0;
  }
  else {
LAB_0034c0b0:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size;
    pSVar21 = (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRBlock_*,_0UL>::resize(&this->vacants,sVar1 - 1);
    }
    (pSVar21->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_003fd260;
    (pSVar21->super_IVariant).self.id = (p->super_IVariant).self.id;
    (pSVar21->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRBlock_003fe9c8;
    HVar4 = p->hint;
    BVar5.id = (p->next_block).id;
    BVar6.id = (p->merge_block).id;
    BVar7.id = (p->continue_block).id;
    IVar8.id = (p->return_value).id;
    IVar9.id = (p->condition).id;
    BVar10.id = (p->true_block).id;
    BVar11.id = (p->false_block).id;
    BVar12.id = (p->default_block).id;
    IVar13.id = (p->mesh).groups[0].id;
    uVar2 = *(undefined8 *)(p->mesh).groups;
    uVar3 = *(undefined8 *)((p->mesh).groups + 2);
    *(undefined8 *)&(pSVar21->super_IVariant).field_0xc =
         *(undefined8 *)&(p->super_IVariant).field_0xc;
    pSVar21->hint = HVar4;
    pSVar21->next_block = (BlockID)BVar5.id;
    pSVar21->merge_block = (BlockID)BVar6.id;
    pSVar21->continue_block = (BlockID)BVar7.id;
    pSVar21->return_value = (ID)IVar8.id;
    pSVar21->condition = (ID)IVar9.id;
    pSVar21->true_block = (BlockID)BVar10.id;
    pSVar21->false_block = (BlockID)BVar11.id;
    pSVar21->default_block = (BlockID)BVar12.id;
    (pSVar21->mesh).groups[0] = (ID)IVar13.id;
    *(undefined8 *)(pSVar21->mesh).groups = uVar2;
    *(undefined8 *)((pSVar21->mesh).groups + 2) = uVar3;
    (pSVar21->ops).super_VectorView<spirv_cross::Instruction>.ptr = (Instruction *)0x0;
    (pSVar21->ops).super_VectorView<spirv_cross::Instruction>.buffer_size = 0;
    (pSVar21->ops).super_VectorView<spirv_cross::Instruction>.ptr =
         (Instruction *)&(pSVar21->ops).stack_storage;
    (pSVar21->ops).buffer_capacity = 8;
    SmallVector<spirv_cross::Instruction,_8UL>::operator=(&pSVar21->ops,&p->ops);
    (pSVar21->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr = (Phi *)0x0;
    (pSVar21->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size = 0;
    (pSVar21->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr =
         (Phi *)&(pSVar21->phi_variables).stack_storage;
    (pSVar21->phi_variables).buffer_capacity = 8;
    SmallVector<spirv_cross::SPIRBlock::Phi,_8UL>::operator=
              (&pSVar21->phi_variables,&p->phi_variables);
    (pSVar21->declare_temporary).
    super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
    .ptr = (pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
            *)0x0;
    (pSVar21->declare_temporary).
    super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
    .buffer_size = 0;
    (pSVar21->declare_temporary).
    super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
    .ptr = (pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
            *)&(pSVar21->declare_temporary).stack_storage;
    (pSVar21->declare_temporary).buffer_capacity = 8;
    SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
    ::operator=(&pSVar21->declare_temporary,&p->declare_temporary);
    (pSVar21->potential_declare_temporary).
    super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
    .ptr = (pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
            *)0x0;
    (pSVar21->potential_declare_temporary).
    super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
    .buffer_size = 0;
    (pSVar21->potential_declare_temporary).
    super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
    .ptr = (pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
            *)&(pSVar21->potential_declare_temporary).stack_storage;
    (pSVar21->potential_declare_temporary).buffer_capacity = 8;
    SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
    ::operator=(&pSVar21->potential_declare_temporary,&p->potential_declare_temporary);
    (pSVar21->cases_32bit).super_VectorView<spirv_cross::SPIRBlock::Case>.ptr = (Case *)0x0;
    (pSVar21->cases_32bit).super_VectorView<spirv_cross::SPIRBlock::Case>.buffer_size = 0;
    (pSVar21->cases_32bit).super_VectorView<spirv_cross::SPIRBlock::Case>.ptr =
         (Case *)&(pSVar21->cases_32bit).stack_storage;
    (pSVar21->cases_32bit).buffer_capacity = 8;
    SmallVector<spirv_cross::SPIRBlock::Case,_8UL>::operator=(&pSVar21->cases_32bit,&p->cases_32bit)
    ;
    (pSVar21->cases_64bit).super_VectorView<spirv_cross::SPIRBlock::Case>.ptr = (Case *)0x0;
    (pSVar21->cases_64bit).super_VectorView<spirv_cross::SPIRBlock::Case>.buffer_size = 0;
    (pSVar21->cases_64bit).super_VectorView<spirv_cross::SPIRBlock::Case>.ptr =
         (Case *)&(pSVar21->cases_64bit).stack_storage;
    (pSVar21->cases_64bit).buffer_capacity = 8;
    SmallVector<spirv_cross::SPIRBlock::Case,_8UL>::operator=(&pSVar21->cases_64bit,&p->cases_64bit)
    ;
    bVar14 = p->complex_continue;
    bVar15 = p->need_ladder_break;
    uVar16 = p->field_0x31b;
    BVar5.id = (p->ignore_phi_from_block).id;
    pSVar21->disable_block_optimization = p->disable_block_optimization;
    pSVar21->complex_continue = bVar14;
    pSVar21->need_ladder_break = bVar15;
    pSVar21->field_0x31b = uVar16;
    pSVar21->ignore_phi_from_block = (BlockID)BVar5.id;
    (pSVar21->loop_dominator).id = (p->loop_dominator).id;
    (pSVar21->dominated_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
    ptr = (TypedID<(spirv_cross::Types)2> *)0x0;
    (pSVar21->dominated_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
    buffer_size = 0;
    (pSVar21->dominated_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
    ptr = (TypedID<(spirv_cross::Types)2> *)&(pSVar21->dominated_variables).stack_storage;
    (pSVar21->dominated_variables).buffer_capacity = 8;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::operator=
              (&pSVar21->dominated_variables,&p->dominated_variables);
    (pSVar21->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr =
         (TypedID<(spirv_cross::Types)2> *)0x0;
    (pSVar21->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
    buffer_size = 0;
    (pSVar21->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr =
         (TypedID<(spirv_cross::Types)2> *)&(pSVar21->loop_variables).stack_storage;
    (pSVar21->loop_variables).buffer_capacity = 8;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::operator=
              (&pSVar21->loop_variables,&p->loop_variables);
    (pSVar21->invalidate_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
    .ptr = (TypedID<(spirv_cross::Types)0> *)0x0;
    (pSVar21->invalidate_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
    .buffer_size = 0;
    (pSVar21->invalidate_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
    .ptr = (TypedID<(spirv_cross::Types)0> *)&(pSVar21->invalidate_expressions).stack_storage;
    (pSVar21->invalidate_expressions).buffer_capacity = 8;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
              (&pSVar21->invalidate_expressions,&p->invalidate_expressions);
  }
  return pSVar21;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}